

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_i2c.c
# Opt level: O0

void csp_i2c_rx(csp_iface_t *iface,csp_packet_t *packet,void *pxTaskWoken)

{
  csp_packet_t *in_RDX;
  void *in_RSI;
  long in_RDI;
  
  if (in_RSI != (void *)0x0) {
    if (*(ushort *)((long)in_RSI + 0x18) < 4) {
      *(int *)(in_RDI + 0x44) = *(int *)(in_RDI + 0x44) + 1;
      if (in_RDX == (csp_packet_t *)0x0) {
        csp_buffer_free(in_RSI);
      }
      else {
        csp_buffer_free_isr(in_RSI);
      }
    }
    else {
      csp_id_strip(in_RDX);
      csp_qfifo_write((csp_packet_t *)iface,(csp_iface_t *)packet,pxTaskWoken);
    }
  }
  return;
}

Assistant:

void csp_i2c_rx(csp_iface_t * iface, csp_packet_t * packet, void * pxTaskWoken) {

	/* Validate input */
	if (packet == NULL) {
		return;
	}

	if (packet->frame_length < sizeof(uint32_t)) {
		iface->frame++;
		(pxTaskWoken != NULL) ? csp_buffer_free_isr(packet) : csp_buffer_free(packet);
		return;
	}

	/* We dont need to check for overflow, since this is already done at the driver level when inserting data into the buffer */

	/* Strip the CSP header off the length field before converting to CSP packet */
    csp_id_strip(packet);

	/* Receive the packet in CSP */
	csp_qfifo_write(packet, iface, pxTaskWoken);
}